

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.c
# Opt level: O3

void qemu_cmdline(char *name,char *value)

{
  int iVar1;
  char *buf;
  char *local_10;
  
  iVar1 = strcmp(name,"android.ril");
  if (iVar1 == 0) {
    iVar1 = asprintf(&local_10,"/dev/%s",value);
    if (iVar1 != -1) {
      log_write(6,"<6>init: nani- buf:: %s\n",local_10);
    }
  }
  return;
}

Assistant:

void qemu_cmdline(const char* name, const char *value)
{
    char *buf;
    if (!strcmp(name, "android.ril")) {
        /* cmd line params currently assume /dev/ prefix */
        if (asprintf(&buf, CMDLINE_PREFIX"/%s", value) == -1) {
            return;
        }
        INFO("nani- buf:: %s\n", buf);
    }
}